

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O2

void __thiscall
density_examples::
any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_equal>
::allocate(any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_equal>
           *this)

{
  tuple_type *ptVar1;
  void *pvVar2;
  
  ptVar1 = (this->m_type).m_feature_table;
  pvVar2 = density::aligned_allocate
                     ((ptVar1->
                      super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy,_density::f_equal>
                      ).super__Head_base<0UL,_density::f_size,_false>._M_head_impl.m_size,
                      (ptVar1->
                      super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy,_density::f_equal>
                      ).
                      super__Tuple_impl<1UL,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy,_density::f_equal>
                      .super__Head_base<1UL,_density::f_alignment,_false>._M_head_impl.m_alignment,0
                     );
  this->m_object = pvVar2;
  return;
}

Assistant:

void allocate() { m_object = density::aligned_allocate(m_type.size(), m_type.alignment()); }